

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::MoveCommand(UCIAdapter *this,char *params)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *params_local;
  Output local_28;
  
  params_local = params;
  iVar3 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar3 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  (this->lastPosition)._M_string_length = 0;
  *(this->lastPosition)._M_dataplus._M_p = '\0';
  if (params != (char *)0x0) {
    while (pcVar4 = NextWord(&params_local), pcVar1 = params_local, *pcVar4 != '\0') {
      bVar2 = IsMove(params_local);
      if (!bVar2) {
LAB_0012e1c5:
        Output::Output(&local_28,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"Invalid move: ");
        std::operator<<((ostream *)&std::cout,pcVar1);
        Output::~Output(&local_28);
        return;
      }
      iVar3 = (*this->engine->_vptr_ChessEngine[10])(this->engine,pcVar1);
      params_local = (char *)CONCAT44(extraout_var,iVar3);
      if (params_local == (char *)0x0) goto LAB_0012e1c5;
      if (ChessEngine::_debug == '\x01') {
        (*this->engine->_vptr_ChessEngine[0xc])();
      }
    }
  }
  return;
}

Assistant:

void UCIAdapter::MoveCommand(const char* params)
{
  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  lastPosition.clear();
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move) || !(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      return;
    }
    if (engine->IsDebugOn()) {
      engine->PrintBoard();
    }
  }
}